

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

int parse_explicit_prime_curve(CBS *in,explicit_prime_curve *out)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  ulong len;
  size_t field_len;
  uint64_t uStack_90;
  uint8_t form;
  uint64_t version;
  undefined1 local_80 [4];
  int has_cofactor;
  CBS cofactor;
  CBS base;
  CBS curve;
  CBS field_type;
  CBS field_id;
  CBS params;
  explicit_prime_curve *out_local;
  CBS *in_local;
  
  iVar1 = CBS_get_asn1(in,(CBS *)&field_id.len,0x20000010);
  if (((((iVar1 != 0) &&
        (iVar1 = CBS_get_asn1_uint64((CBS *)&field_id.len,&stack0xffffffffffffff70), iVar1 != 0)) &&
       (uStack_90 == 1)) &&
      ((iVar1 = CBS_get_asn1((CBS *)&field_id.len,(CBS *)&field_type.len,0x20000010), iVar1 != 0 &&
       (iVar1 = CBS_get_asn1((CBS *)&field_type.len,(CBS *)&curve.len,6), iVar1 != 0)))) &&
     (sVar2 = CBS_len((CBS *)&curve.len), sVar2 == 7)) {
    puVar3 = CBS_data((CBS *)&curve.len);
    iVar1 = OPENSSL_memcmp(puVar3,kPrimeField,7);
    if ((((iVar1 == 0) && (iVar1 = CBS_get_asn1((CBS *)&field_type.len,&out->prime,2), iVar1 != 0))
        && ((iVar1 = CBS_is_unsigned_asn1_integer(&out->prime), iVar1 != 0 &&
            (((sVar2 = CBS_len((CBS *)&field_type.len), sVar2 == 0 &&
              (iVar1 = CBS_get_asn1((CBS *)&field_id.len,(CBS *)&base.len,0x20000010), iVar1 != 0))
             && (iVar1 = CBS_get_asn1((CBS *)&base.len,&out->a,4), iVar1 != 0)))))) &&
       (((iVar1 = CBS_get_asn1((CBS *)&base.len,&out->b,4), iVar1 != 0 &&
         (iVar1 = CBS_get_optional_asn1((CBS *)&base.len,(CBS *)0x0,(int *)0x0,3), iVar1 != 0)) &&
        ((sVar2 = CBS_len((CBS *)&base.len), sVar2 == 0 &&
         (((iVar1 = CBS_get_asn1((CBS *)&field_id.len,(CBS *)&cofactor.len,4), iVar1 != 0 &&
           (iVar1 = CBS_get_asn1((CBS *)&field_id.len,&out->order,2), iVar1 != 0)) &&
          ((iVar1 = CBS_is_unsigned_asn1_integer(&out->order), iVar1 != 0 &&
           ((iVar1 = CBS_get_optional_asn1
                               ((CBS *)&field_id.len,(CBS *)local_80,(int *)((long)&version + 4),2),
            iVar1 != 0 && (sVar2 = CBS_len((CBS *)&field_id.len), sVar2 == 0)))))))))))) {
      if ((version._4_4_ != 0) &&
         ((sVar2 = CBS_len((CBS *)local_80), sVar2 != 1 ||
          (puVar3 = CBS_data((CBS *)local_80), *puVar3 != '\x01')))) {
        ERR_put_error(0xf,0,0x7b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                      ,0xfc);
        return 0;
      }
      iVar1 = CBS_get_u8((CBS *)&cofactor.len,(uint8_t *)((long)&field_len + 7));
      if ((iVar1 != 0) && (field_len._7_1_ == '\x04')) {
        sVar2 = CBS_len((CBS *)&cofactor.len);
        if ((sVar2 & 1) != 0) {
          ERR_put_error(0xf,0,0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                        ,0x109);
          return 0;
        }
        sVar2 = CBS_len((CBS *)&cofactor.len);
        len = sVar2 >> 1;
        puVar3 = CBS_data((CBS *)&cofactor.len);
        CBS_init(&out->base_x,puVar3,len);
        puVar3 = CBS_data((CBS *)&cofactor.len);
        CBS_init(&out->base_y,puVar3 + len,len);
        return 1;
      }
      ERR_put_error(0xf,0,0x6f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                    ,0x104);
      return 0;
    }
  }
  ERR_put_error(0xf,0,0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                ,0xf4);
  return 0;
}

Assistant:

static int parse_explicit_prime_curve(CBS *in,
                                      struct explicit_prime_curve *out) {
  // See RFC 3279, section 2.3.5. Note that RFC 3279 calls this structure an
  // ECParameters while RFC 5480 calls it a SpecifiedECDomain.
  CBS params, field_id, field_type, curve, base, cofactor;
  int has_cofactor;
  uint64_t version;
  if (!CBS_get_asn1(in, &params, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&params, &version) ||  //
      version != 1 ||                             //
      !CBS_get_asn1(&params, &field_id, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&field_id, &field_type, CBS_ASN1_OBJECT) ||
      CBS_len(&field_type) != sizeof(kPrimeField) ||
      OPENSSL_memcmp(CBS_data(&field_type), kPrimeField, sizeof(kPrimeField)) !=
          0 ||
      !CBS_get_asn1(&field_id, &out->prime, CBS_ASN1_INTEGER) ||
      !CBS_is_unsigned_asn1_integer(&out->prime) ||  //
      CBS_len(&field_id) != 0 ||
      !CBS_get_asn1(&params, &curve, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&curve, &out->a, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1(&curve, &out->b, CBS_ASN1_OCTETSTRING) ||
      // |curve| has an optional BIT STRING seed which we ignore.
      !CBS_get_optional_asn1(&curve, NULL, NULL, CBS_ASN1_BITSTRING) ||
      CBS_len(&curve) != 0 ||
      !CBS_get_asn1(&params, &base, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1(&params, &out->order, CBS_ASN1_INTEGER) ||
      !CBS_is_unsigned_asn1_integer(&out->order) ||
      !CBS_get_optional_asn1(&params, &cofactor, &has_cofactor,
                             CBS_ASN1_INTEGER) ||
      CBS_len(&params) != 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return 0;
  }

  if (has_cofactor) {
    // We only support prime-order curves so the cofactor must be one.
    if (CBS_len(&cofactor) != 1 ||  //
        CBS_data(&cofactor)[0] != 1) {
      OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
      return 0;
    }
  }

  // Require that the base point use uncompressed form.
  uint8_t form;
  if (!CBS_get_u8(&base, &form) || form != POINT_CONVERSION_UNCOMPRESSED) {
    OPENSSL_PUT_ERROR(EC, EC_R_INVALID_FORM);
    return 0;
  }

  if (CBS_len(&base) % 2 != 0) {
    OPENSSL_PUT_ERROR(EC, EC_R_DECODE_ERROR);
    return 0;
  }
  size_t field_len = CBS_len(&base) / 2;
  CBS_init(&out->base_x, CBS_data(&base), field_len);
  CBS_init(&out->base_y, CBS_data(&base) + field_len, field_len);

  return 1;
}